

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

QSize __thiscall
QPixmapStyle::comboBoxSizeFromContents
          (QPixmapStyle *this,QStyleOption *option,QSize *contentsSize,QWidget *widget)

{
  long lVar1;
  QPixmapStylePrivate *pQVar2;
  QSize QVar3;
  QPixmapStylePrivate *in_RDI;
  long in_FS_OFFSET;
  QPixmapStyleDescriptor *desc;
  QPixmapStylePrivate *d;
  QWidget *in_stack_00000070;
  QSize result;
  QStyleOption *in_stack_00000080;
  ContentsType in_stack_0000008c;
  QCommonStyle *in_stack_00000090;
  QPixmapStyleDescriptor *desc_00;
  ControlDescriptor *in_stack_ffffffffffffff50;
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *in_stack_ffffffffffffff58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QPixmapStyle *)0x4012cf);
  desc_00 = (QPixmapStyleDescriptor *)&DAT_aaaaaaaaaaaaaaaa;
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  QCommonStyle::sizeFromContents
            (in_stack_00000090,in_stack_0000008c,in_stack_00000080,(QSize *)result,in_stack_00000070
            );
  QSize::width((QSize *)0x401371);
  QSize::height((QSize *)0x40137f);
  QVar3 = QPixmapStylePrivate::computeSize(in_RDI,desc_00,(int)((ulong)pQVar2 >> 0x20),(int)pQVar2);
  QPixmapStyleDescriptor::~QPixmapStyleDescriptor((QPixmapStyleDescriptor *)0x4013a3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QSize QPixmapStyle::comboBoxSizeFromContents(const QStyleOption *option,
                                             const QSize &contentsSize,
                                             const QWidget *widget) const
{
    Q_D(const QPixmapStyle);

    const QPixmapStyleDescriptor &desc = d->descriptors.value(DD_ButtonEnabled);

    QSize result = QCommonStyle::sizeFromContents(CT_ComboBox, option, contentsSize, widget);
    return d->computeSize(desc, result.width(), result.height());
}